

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O1

bool __thiscall glob::glob::next(glob *this)

{
  glob_impl *pgVar1;
  int iVar2;
  dirent *pdVar3;
  
  do {
    pdVar3 = readdir((DIR *)((this->impl_)._M_t.
                             super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>
                             .super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir);
    ((this->impl_)._M_t.
     super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
     super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
     super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir_entry = (dirent *)pdVar3;
    if (pdVar3 == (dirent *)0x0) break;
    pgVar1 = (this->impl_)._M_t.
             super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
             super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
             super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl;
    iVar2 = fnmatch((pgVar1->file_pattern)._M_dataplus._M_p,pgVar1->dir_entry->d_name,0x16);
  } while (iVar2 != 0);
  return pdVar3 != (dirent *)0x0;
}

Assistant:

bool glob::next()
{
#ifdef GLOB_WINDOWS
    impl_->has_next =
        FindNextFileA(impl_->find_handle, &impl_->find_data) != 0;
    return impl_->has_next;
#else
    while ((impl_->dir_entry = readdir(impl_->dir)) != nullptr) {
        if (!fnmatch(impl_->file_pattern.c_str(),
                    impl_->dir_entry->d_name,
                    FNM_CASEFOLD | FNM_NOESCAPE | FNM_PERIOD)) {
            return true;
        }
    }
    return false;
#endif
}